

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::InitializeDecryption
          (AESStateMBEDTLS *this,const_data_ptr_t iv,idx_t iv_len,string *key)

{
  int iVar1;
  pointer this_00;
  mbedtls_cipher_context_t *ctx;
  size_t in_RDI;
  unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
  *in_stack_ffffffffffffffb0;
  runtime_error local_40 [16];
  runtime_error local_30 [48];
  
  *(undefined4 *)(in_RDI + 8) = 1;
  this_00 = std::
            unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>::
            get(in_stack_ffffffffffffffb0);
  ctx = (mbedtls_cipher_context_t *)std::__cxx11::string::data();
  std::__cxx11::string::length();
  iVar1 = mbedtls_cipher_setkey
                    (ctx,(uchar *)this_00,(int)(in_RDI >> 0x20),(mbedtls_operation_t)in_RDI);
  if (iVar1 != 0) {
    std::runtime_error::runtime_error(local_30,"Failed to set AES key for decryption");
    std::runtime_error::~runtime_error(local_30);
  }
  std::unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>::get
            ((unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_> *
             )this_00);
  iVar1 = mbedtls_cipher_set_iv(ctx,(uchar *)this_00,in_RDI);
  if (iVar1 != 0) {
    std::runtime_error::runtime_error(local_40,"Failed to set IV for decryption");
    std::runtime_error::~runtime_error(local_40);
  }
  return;
}

Assistant:

void MbedTlsWrapper::AESStateMBEDTLS::InitializeDecryption(duckdb::const_data_ptr_t iv, duckdb::idx_t iv_len, const std::string *key) {
	mode = DECRYPT;

	if (mbedtls_cipher_setkey(context.get(), reinterpret_cast<const unsigned char *>(key->data()), key->length() * 8, MBEDTLS_DECRYPT) != 0) {
		runtime_error("Failed to set AES key for decryption");
	}

	if (mbedtls_cipher_set_iv(context.get(), iv, iv_len) != 0) {
		runtime_error("Failed to set IV for decryption");
	}
}